

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b3cdf::ParserImpl::ParsePrefixExpTail
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp,
          PrefixExpType *type)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  SyntaxTree *pSVar7;
  SyntaxTree *pSVar8;
  TokenDetail op;
  Lexer *pLVar9;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar10;
  TokenDetail *pTVar11;
  undefined8 *puVar12;
  TokenDetail *pTVar13;
  ParseException *pPVar14;
  undefined4 *in_RCX;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_1;
  TokenDetail member;
  Lexer *local_78;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_70;
  String *local_68;
  long *local_60;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_58;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_50;
  String *local_48;
  SyntaxTree *pSStack_40;
  
  pTVar11 = (TokenDetail *)(exp + 5);
  if (*(int *)&exp[8]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(exp->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11);
  }
  if (*(int *)&exp[8]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x5b) {
    if (*(int *)&exp[8]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(exp->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11);
    }
    if (*(int *)&exp[8]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x2e) {
      if (*(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(exp->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11);
      }
      if (*(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x3a) {
        if (*(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
          luna::Lexer::GetToken
                    ((Lexer *)(exp->_M_t).
                              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                              .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11
                    );
        }
        if (*(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x28) {
          if (*(int *)&exp[8]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
            luna::Lexer::GetToken
                      ((Lexer *)(exp->_M_t).
                                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                                .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                       pTVar11);
          }
          if (*(int *)&exp[8]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x7b) {
            if (*(int *)&exp[8]._M_t.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
              luna::Lexer::GetToken
                        ((Lexer *)(exp->_M_t).
                                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                         pTVar11);
            }
            if (*(int *)&exp[8]._M_t.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x116) {
              this->lexer_ = *(Lexer **)type;
              type[0] = PrefixExpType_Normal;
              type[1] = PrefixExpType_Normal;
              return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)this;
            }
          }
        }
      }
      if (in_RCX != (undefined4 *)0x0) {
        *in_RCX = 2;
      }
      uVar3 = *(undefined8 *)type;
      type[0] = PrefixExpType_Normal;
      type[1] = PrefixExpType_Normal;
      if (*(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(exp->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11);
      }
      if (*(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x3a) {
        NextToken((ParserImpl *)exp);
        pTVar13 = NextToken((ParserImpl *)exp);
        if (pTVar13->token_ != 0x115) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    (pPVar14,"expect \'id\' after \':\'",(TokenDetail *)(exp + 1));
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        local_58 = ((TokenDetail *)(exp + 1))->field_0;
        aStack_50 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(exp + 2);
        local_48 = (String *)
                   exp[3]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        pSStack_40 = exp[4]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        if (*(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
          luna::Lexer::GetToken
                    ((Lexer *)(exp->_M_t).
                              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                              .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11
                    );
        }
        uVar2 = *(undefined4 *)
                 &exp[7]._M_t.
                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        ParseArgs((ParserImpl *)&local_78);
        puVar12 = (undefined8 *)operator_new(0x40);
        pLVar9 = local_78;
        local_78 = (Lexer *)0x0;
        *puVar12 = &PTR__MemberFuncCall_00189548;
        puVar12[1] = uVar3;
        *(undefined4 *)(puVar12 + 2) = local_58._0_4_;
        *(undefined4 *)((long)puVar12 + 0x14) = local_58._4_4_;
        *(undefined4 *)(puVar12 + 3) = aStack_50._0_4_;
        *(undefined4 *)((long)puVar12 + 0x1c) = aStack_50._4_4_;
        puVar12[4] = local_48;
        puVar12[5] = pSStack_40;
        puVar12[6] = pLVar9;
        *(undefined4 *)(puVar12 + 7) = uVar2;
      }
      else {
        if (*(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
          luna::Lexer::GetToken
                    ((Lexer *)(exp->_M_t).
                              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                              .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11
                    );
        }
        uVar2 = *(undefined4 *)
                 &exp[7]._M_t.
                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        ParseArgs((ParserImpl *)&local_58);
        puVar12 = (undefined8 *)operator_new(0x20);
        aVar10 = local_58;
        local_58.number_ = 0.0;
        *puVar12 = &PTR__NormalFuncCall_00189508;
        puVar12[1] = uVar3;
        *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(puVar12 + 2) = aVar10;
        *(undefined4 *)(puVar12 + 3) = uVar2;
      }
      plVar4 = *(long **)type;
      *(undefined8 **)type = puVar12;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      local_70 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type;
      type[0] = PrefixExpType_Normal;
      type[1] = PrefixExpType_Normal;
      ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_70);
      if (local_70.str_ == (String *)0x0) {
        return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)this;
      }
      (*((local_70.str_)->super_GCObject)._vptr_GCObject[1])();
      return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)this;
    }
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 1;
  }
  uVar3 = *(undefined8 *)type;
  type[0] = PrefixExpType_Normal;
  type[1] = PrefixExpType_Normal;
  NextToken((ParserImpl *)exp);
  pTVar13 = (TokenDetail *)(exp + 1);
  iVar1 = *(int *)&exp[4]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (iVar1 == 0x2e) {
    pTVar11 = NextToken((ParserImpl *)exp);
    if (pTVar11->token_ != 0x115) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'id\' after \'.\'",pTVar13);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    puVar12 = (undefined8 *)operator_new(0x38);
    *puVar12 = &PTR__MemberAccessor_001894c8;
    puVar12[1] = uVar3;
    uVar2 = *(undefined4 *)
             ((long)&exp[1]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    uVar5 = *(undefined4 *)
             &exp[2]._M_t.
              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
              super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    uVar6 = *(undefined4 *)
             ((long)&exp[2]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    pSVar7 = exp[3]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    pSVar8 = exp[4]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    *(undefined4 *)(puVar12 + 2) = *(undefined4 *)&pTVar13->field_0;
    *(undefined4 *)((long)puVar12 + 0x14) = uVar2;
    *(undefined4 *)(puVar12 + 3) = uVar5;
    *(undefined4 *)((long)puVar12 + 0x1c) = uVar6;
    puVar12[4] = pSVar7;
    puVar12[5] = pSVar8;
    *(undefined4 *)(puVar12 + 6) = 0;
  }
  else {
    if (iVar1 != 0x5b) {
      __assert_fail("current_.token_ == \'[\' || current_.token_ == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x295,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseVar(std::unique_ptr<SyntaxTree>)"
                   );
    }
    if (*(int *)&exp[8]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(exp->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar11);
    }
    uVar2 = *(undefined4 *)
             &exp[7]._M_t.
              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
              super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    local_60 = (long *)0x0;
    local_58.number_ = 0.0;
    aStack_50.number_ = 0.0;
    local_48 = (String *)0x0;
    pSStack_40 = (SyntaxTree *)CONCAT44(pSStack_40._4_4_,0x11e);
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    op._24_8_ = pSStack_40;
    ParseExp((ParserImpl *)&local_78,exp,op,(int)&local_60);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
    pTVar11 = NextToken((ParserImpl *)exp);
    if (pTVar11->token_ != 0x5d) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \']\'",pTVar13);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    puVar12 = (undefined8 *)operator_new(0x20);
    pLVar9 = local_78;
    local_78 = (Lexer *)0x0;
    *puVar12 = &PTR__IndexAccessor_00189488;
    puVar12[1] = uVar3;
    puVar12[2] = pLVar9;
    *(undefined4 *)(puVar12 + 3) = uVar2;
    *(undefined4 *)((long)puVar12 + 0x1c) = 0;
  }
  plVar4 = *(long **)type;
  *(undefined8 **)type = puVar12;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  local_68 = *(String **)type;
  type[0] = PrefixExpType_Normal;
  type[1] = PrefixExpType_Normal;
  ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_68);
  if (local_68 != (String *)0x0) {
    (*(local_68->super_GCObject)._vptr_GCObject[1])();
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExpTail(std::unique_ptr<SyntaxTree> exp,
                                                       PrefixExpType *type)
        {
            if (LookAhead().token_ == '[' || LookAhead().token_ == '.')
            {
                if (type) *type = PrefixExpType_Var;
                exp = ParseVar(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else if (LookAhead().token_ == ':' || LookAhead().token_ == '(' ||
                     LookAhead().token_ == '{' || LookAhead().token_ == Token_String)
            {
                if (type) *type = PrefixExpType_Functioncall;
                exp = ParseFunctionCall(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else
            {
                return exp;
            }
        }